

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O1

const_iterator __thiscall
pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator::operator+
          (const_iterator *this,uint x)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  const_iterator cVar7;
  
  uVar4 = this->bitmap_;
  sVar2 = this->pos_;
  if (x != 0) {
    uVar5 = (ulong)x;
    do {
      uVar3 = uVar4 >> 1;
      sVar2 = sVar2 + 1;
      bVar6 = 1 < uVar4;
      uVar4 = uVar3;
      if (bVar6) {
        uVar1 = bit_count::ctz((ulong)uVar3);
        uVar4 = uVar3 >> ((byte)uVar1 & 0x1f);
        sVar2 = sVar2 + uVar1;
      }
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  cVar7._4_4_ = 0;
  cVar7.bitmap_ = uVar4;
  cVar7.pos_ = sVar2;
  return cVar7;
}

Assistant:

const_iterator operator+ (unsigned x) const {
                    auto result = *this;
                    std::advance (result, x);
                    return result;
                }